

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info_manager.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::analysis::DebugInfoManager::IsAncestorOfScope
          (DebugInfoManager *this,uint32_t scope,uint32_t ancestor)

{
  uint32_t local_24;
  uint32_t ancestor_scope_itr;
  uint32_t ancestor_local;
  uint32_t scope_local;
  DebugInfoManager *this_local;
  
  local_24 = scope;
  while( true ) {
    if (local_24 == 0) {
      return false;
    }
    if (ancestor == local_24) break;
    local_24 = GetParentScope(this,local_24);
  }
  return true;
}

Assistant:

bool DebugInfoManager::IsAncestorOfScope(uint32_t scope, uint32_t ancestor) {
  uint32_t ancestor_scope_itr = scope;
  while (ancestor_scope_itr != kNoDebugScope) {
    if (ancestor == ancestor_scope_itr) return true;
    ancestor_scope_itr = GetParentScope(ancestor_scope_itr);
  }
  return false;
}